

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O2

void __thiscall
amrex::LineDistFcnElement2d::single_seg_cpdist
          (LineDistFcnElement2d *this,RealVect pt,Real x0,Real x1,Real y0,Real y1,RealVect *cp,
          Real *dist)

{
  double dVar1;
  Real RVar2;
  double dVar3;
  Real RVar4;
  Real RVar5;
  double dVar6;
  
  dVar1 = x1 - x0;
  dVar3 = y1 - y0;
  dVar6 = ((pt.vect[0] - x0) * dVar1 + (pt.vect[1] - y0) * dVar3) / (dVar1 * dVar1 + dVar3 * dVar3);
  RVar5 = 0.0;
  RVar2 = x0;
  RVar4 = y0;
  if ((0.0 <= dVar6) && (RVar2 = x1, RVar4 = y1, dVar6 <= 1.0)) {
    RVar2 = dVar1 * dVar6 + x0;
    RVar4 = dVar3 * dVar6 + y0;
    RVar5 = dVar6 * 0.0 + 0.0;
  }
  cp->vect[0] = RVar2;
  cp->vect[1] = RVar4;
  cp->vect[2] = RVar5;
  *dist = SQRT((pt.vect[0] - RVar2) * (pt.vect[0] - RVar2) +
               (pt.vect[1] - RVar4) * (pt.vect[1] - RVar4));
  return;
}

Assistant:

void LineDistFcnElement2d::single_seg_cpdist(amrex::RealVect pt,
                                             amrex::Real x0, amrex::Real x1,
                                             amrex::Real y0, amrex::Real y1,
                                             amrex::RealVect& cp,
                                             amrex::Real& dist) const {
  amrex::RealVect A(AMREX_D_DECL(pt[0]-x0, pt[1]-y0,0.0));
  amrex::RealVect B(AMREX_D_DECL(x1-x0, y1-y0,0.0));

  amrex::Real magBsq = B[0]*B[0] + B[1]*B[1];
  amrex::Real t =  (A[0]*B[0] + A[1]*B[1])/magBsq;

  if (t < 0) {
    cp = amrex::RealVect(AMREX_D_DECL(x0,y0,0.0));
  } else if (t > 1.0) {
    cp = amrex::RealVect(AMREX_D_DECL(x1,y1,0.0));
  } else {
    cp  = amrex::RealVect(AMREX_D_DECL(x0,y0,0.0)) + t*B;
  }

  amrex::RealVect delta = pt - cp;
  dist = sqrt(delta[0]*delta[0] + delta[1]*delta[1] );

  return;
}